

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_clear_eol(Fl_Input *this)

{
  int iVar1;
  int iVar2;
  undefined4 local_1c;
  int i;
  Fl_Input *this_local;
  
  iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_);
  if (iVar1 == 0) {
    iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
    iVar2 = Fl_Input_::size(&this->super_Fl_Input_);
    if (iVar1 < iVar2) {
      iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
      local_1c = Fl_Input_::line_end(&this->super_Fl_Input_,iVar1);
      iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
      if (local_1c == iVar1) {
        iVar1 = Fl_Input_::size(&this->super_Fl_Input_);
        if (local_1c < iVar1) {
          local_1c = local_1c + 1;
        }
      }
      iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
      Fl_Input_::cut(&this->super_Fl_Input_,iVar1,local_1c);
      this_local._4_4_ = Fl_Input_::copy_cuts(&this->super_Fl_Input_);
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    fl_beep(0);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input::kf_clear_eol() {
  if (readonly()) { fl_beep(); return 1; }
  if (position()>=size()) return 0;
  int i = line_end(position());
  if (i == position() && i < size()) i++;
  cut(position(), i);
  return copy_cuts();
}